

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::LogicalType::printTo(LogicalType *this,ostream *out)

{
  ostream *poVar1;
  string sStack_38;
  
  std::operator<<(out,"LogicalType(");
  std::operator<<(out,"STRING=");
  if (((ushort)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::StringType>(&sStack_38,&this->STRING);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"MAP=");
  if (((ushort)this->__isset & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::MapType>(&sStack_38,&this->MAP);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"LIST=");
  if (((ushort)this->__isset & 4) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::ListType>(&sStack_38,&this->LIST);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"ENUM=");
  if (((ushort)this->__isset & 8) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::EnumType>(&sStack_38,&this->ENUM);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"DECIMAL=");
  if (((ushort)this->__isset & 0x10) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::DecimalType>(&sStack_38,&this->DECIMAL);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"DATE=");
  if (((ushort)this->__isset & 0x20) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::DateType>(&sStack_38,&this->DATE);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"TIME=");
  if (((ushort)this->__isset & 0x40) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::TimeType>(&sStack_38,&this->TIME);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"TIMESTAMP=");
  if (((ushort)this->__isset & 0x80) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::TimestampType>(&sStack_38,&this->TIMESTAMP);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"INTEGER=");
  if (((this->__isset).field_0x1 & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::IntType>(&sStack_38,&this->INTEGER);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"UNKNOWN=");
  if (((this->__isset).field_0x1 & 2) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::NullType>(&sStack_38,&this->UNKNOWN);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"JSON=");
  if (((this->__isset).field_0x1 & 4) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::JsonType>(&sStack_38,&this->JSON);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"BSON=");
  if (((this->__isset).field_0x1 & 8) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::BsonType>(&sStack_38,&this->BSON);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"UUID=");
  if (((this->__isset).field_0x1 & 0x10) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::UUIDType>(&sStack_38,&this->UUID);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"FLOAT16=");
  if (((this->__isset).field_0x1 & 0x20) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Float16Type>(&sStack_38,&this->FLOAT16);
    std::operator<<(out,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void LogicalType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "LogicalType(";
  out << "STRING="; (__isset.STRING ? (out << to_string(STRING)) : (out << "<null>"));
  out << ", " << "MAP="; (__isset.MAP ? (out << to_string(MAP)) : (out << "<null>"));
  out << ", " << "LIST="; (__isset.LIST ? (out << to_string(LIST)) : (out << "<null>"));
  out << ", " << "ENUM="; (__isset.ENUM ? (out << to_string(ENUM)) : (out << "<null>"));
  out << ", " << "DECIMAL="; (__isset.DECIMAL ? (out << to_string(DECIMAL)) : (out << "<null>"));
  out << ", " << "DATE="; (__isset.DATE ? (out << to_string(DATE)) : (out << "<null>"));
  out << ", " << "TIME="; (__isset.TIME ? (out << to_string(TIME)) : (out << "<null>"));
  out << ", " << "TIMESTAMP="; (__isset.TIMESTAMP ? (out << to_string(TIMESTAMP)) : (out << "<null>"));
  out << ", " << "INTEGER="; (__isset.INTEGER ? (out << to_string(INTEGER)) : (out << "<null>"));
  out << ", " << "UNKNOWN="; (__isset.UNKNOWN ? (out << to_string(UNKNOWN)) : (out << "<null>"));
  out << ", " << "JSON="; (__isset.JSON ? (out << to_string(JSON)) : (out << "<null>"));
  out << ", " << "BSON="; (__isset.BSON ? (out << to_string(BSON)) : (out << "<null>"));
  out << ", " << "UUID="; (__isset.UUID ? (out << to_string(UUID)) : (out << "<null>"));
  out << ", " << "FLOAT16="; (__isset.FLOAT16 ? (out << to_string(FLOAT16)) : (out << "<null>"));
  out << ")";
}